

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O3

void __thiscall Kernel::Inference::Inference(Inference *this,GeneratingInferenceMany *gi)

{
  uint uVar1;
  uint uVar2;
  UnitList *pUVar3;
  
  initMany(this,gi->rule,gi->premises);
  this->_age = 0;
  pUVar3 = gi->premises;
  if (pUVar3 == (UnitList *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    do {
      uVar1 = (pUVar3->_head->_inference)._age;
      if (uVar1 < uVar2) {
        uVar1 = uVar2;
      }
      uVar2 = uVar1;
      this->_age = uVar2;
      pUVar3 = pUVar3->_tail;
    } while (pUVar3 != (List<Kernel::Unit_*> *)0x0);
    uVar2 = uVar2 + 1;
  }
  this->_age = uVar2;
  return;
}

Assistant:

Inference::Inference(const GeneratingInferenceMany& gi) {
  initMany(gi.rule,gi.premises);

  ASS_REP(isGeneratingInferenceRule(gi.rule),ruleName(gi.rule));
  _age = 0;
  UnitList* it= gi.premises;
  while(it) {
    Unit* prem = it->head();
    ASS(prem->isClause());
    _age = std::max(_age,prem->inference().age());
    it=it->tail();
  }
  _age++;
}